

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2edge_distances.cc
# Opt level: O2

S2Point * S2::Interpolate(S2Point *__return_storage_ptr__,double t,S2Point *a,S2Point *b)

{
  VType VVar1;
  VType VVar2;
  S1Angle ab;
  S1Angle local_28;
  
  if ((t != 0.0) || (NAN(t))) {
    if ((t != 1.0) || (NAN(t))) {
      S1Angle::S1Angle(&local_28,a,b);
      InterpolateAtDistance(__return_storage_ptr__,(S1Angle)(t * local_28.radians_),a,b);
      return __return_storage_ptr__;
    }
    __return_storage_ptr__->c_[2] = b->c_[2];
    VVar1 = b->c_[0];
    VVar2 = b->c_[1];
  }
  else {
    __return_storage_ptr__->c_[2] = a->c_[2];
    VVar1 = a->c_[0];
    VVar2 = a->c_[1];
  }
  __return_storage_ptr__->c_[0] = VVar1;
  __return_storage_ptr__->c_[1] = VVar2;
  return __return_storage_ptr__;
}

Assistant:

S2Point Interpolate(double t, const S2Point& a, const S2Point& b) {
  if (t == 0) return a;
  if (t == 1) return b;
  S1Angle ab(a, b);
  return InterpolateAtDistance(t * ab, a, b);
}